

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O2

void __thiscall slang::IntervalMapDetails::Path::moveRight(Path *this,uint32_t level)

{
  pointer pEVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong *puVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  iVar10 = -1;
  iVar3 = 0;
  do {
    iVar4 = iVar3;
    if (level - 1 == iVar4) {
      uVar8 = pEVar1->size;
      uVar5 = pEVar1->offset;
      uVar9 = 0;
      goto LAB_002edb11;
    }
    uVar8 = pEVar1[level + iVar10].size;
    uVar5 = pEVar1[level + iVar10].offset;
    iVar10 = iVar10 + -1;
    iVar3 = iVar4 + 1;
  } while (uVar5 == uVar8 - 1);
  uVar9 = level - (iVar4 + 1);
LAB_002edb11:
  uVar6 = uVar5 + 1;
  pEVar1[uVar9].offset = uVar6;
  if (uVar6 != uVar8) {
    iVar4 = -iVar4;
    puVar7 = (ulong *)((ulong)uVar6 * 8 + (long)pEVar1[uVar9].node);
    while( true ) {
      uVar2 = *puVar7;
      puVar7 = (ulong *)(uVar2 & 0xffffffffffffffc0);
      uVar5 = ((uint)uVar2 & 0x3f) + 1;
      pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      if (iVar4 == 0) break;
      uVar8 = level + iVar4;
      pEVar1[uVar8].node = puVar7;
      pEVar1[uVar8].size = uVar5;
      pEVar1[uVar8].offset = 0;
      iVar4 = iVar4 + 1;
    }
    pEVar1[level].node = puVar7;
    pEVar1[level].size = uVar5;
    pEVar1[level].offset = 0;
  }
  return;
}

Assistant:

void Path::moveRight(uint32_t level) {
    SLANG_ASSERT(level);

    // Go up the tree until we find a node where we can go right.
    uint32_t l = level - 1;
    while (l && path[l].offset == path[l].size - 1)
        --l;

    // If we hit the end we've gone as far as we can.
    if (++path[l].offset == path[l].size)
        return;

    NodeRef nodeRef = childAt(l);
    for (++l; l != level; ++l) {
        path[l] = Entry(nodeRef, 0);
        nodeRef = nodeRef.childAt(0);
    }
    path[l] = Entry(nodeRef, 0);
}